

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

void __thiscall
sf::Shader::UniformBinder::UniformBinder(UniformBinder *this,Shader *shader,string *name)

{
  GLhandleARB GVar1;
  int iVar2;
  undefined4 *in_RSI;
  NonCopyable *in_RDI;
  string *in_stack_00000060;
  Shader *in_stack_00000068;
  
  NonCopyable::NonCopyable(in_RDI);
  GlResource::TransientContextLock::TransientContextLock((TransientContextLock *)(in_RDI + 1));
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)(in_RDI + 8) = *in_RSI;
  *(undefined4 *)(in_RDI + 0xc) = 0xffffffff;
  if (*(int *)(in_RDI + 8) != 0) {
    GVar1 = (*sf_glad_glGetHandleARB)(0x8b40);
    *(GLhandleARB *)(in_RDI + 4) = GVar1;
    if (*(int *)(in_RDI + 8) != *(int *)(in_RDI + 4)) {
      (*sf_glad_glUseProgramObjectARB)(*(GLhandleARB *)(in_RDI + 8));
    }
    iVar2 = getUniformLocation(in_stack_00000068,in_stack_00000060);
    *(int *)(in_RDI + 0xc) = iVar2;
  }
  return;
}

Assistant:

UniformBinder(Shader& shader, const std::string& name) :
    savedProgram(0),
    currentProgram(castToGlHandle(shader.m_shaderProgram)),
    location(-1)
    {
        if (currentProgram)
        {
            // Enable program object
            glCheck(savedProgram = GLEXT_glGetHandle(GLEXT_GL_PROGRAM_OBJECT));
            if (currentProgram != savedProgram)
                glCheck(GLEXT_glUseProgramObject(currentProgram));

            // Store uniform location for further use outside constructor
            location = shader.getUniformLocation(name);
        }
    }